

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

Partition * __thiscall ASDCP::MXF::Partition::InitFromFile(Partition *this,IFileReader *Reader)

{
  KLVFilePacket::InitFromFile(&this->super_KLVFilePacket,Reader);
  if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
    InitFromBuffer((Partition *)&stack0xffffffffffffff88,(byte_t *)Reader,
                   (ui32_t)*(undefined8 *)(Reader + 0x18));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff88);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff88);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::InitFromFile(const Kumu::IFileReader& Reader)
{
  Result_t result = KLVFilePacket::InitFromFile(Reader);
  // test the UL
  // could be one of several values
  if ( ASDCP_SUCCESS(result) )
    result = ASDCP::MXF::Partition::InitFromBuffer(m_ValueStart, m_ValueLength);
  
  return result;
}